

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

MatrixXd *
Util::GetGravJac(Vector3d *pos,Vector3d *vel,double Rearth,double wEarth,double mu,double J2,
                double J3,double drag_coeff)

{
  double dVar1;
  double dVar2;
  double __x;
  double dVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  MatrixXd *in_RDI;
  double in_XMM0_Qa;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *this;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double t17;
  double t18;
  double t16;
  double t15;
  double t13;
  double t12;
  double t10;
  double t8;
  double t6;
  double t4;
  double t2;
  double c_A_vec_tmp;
  double b_A_vec_tmp;
  double A_vec_tmp;
  double t47_tmp;
  double b_t47_tmp_tmp;
  double t47_tmp_tmp;
  double b_t42_tmp;
  double t42_tmp;
  double t42_tmp_tmp;
  double t40_tmp;
  double t36;
  double t35;
  double t32;
  double t31;
  double t30;
  double t28;
  double t24;
  double t29;
  double t27;
  double t26;
  double t25;
  double t23;
  double t47;
  double t14;
  double t11;
  double t9;
  double t7;
  double t5;
  double t3;
  double A_vec [9];
  double v_z;
  double v_y;
  double v_x;
  double z;
  double y;
  double x;
  MatrixXd *jac;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffffae8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_fffffffffffffaf0;
  Index in_stack_fffffffffffffaf8;
  Index in_stack_fffffffffffffb10;
  Index in_stack_fffffffffffffb18;
  Index in_stack_fffffffffffffb20;
  Index in_stack_fffffffffffffb28;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffb30;
  
  dVar3 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8);
  dVar39 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8);
  dVar38 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8);
  dVar37 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8);
  dVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8);
  dVar2 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8);
  __x = *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (in_stack_fffffffffffffaf8,(Index)in_stack_fffffffffffffaf0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffaf0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffffae8);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity
            (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
             (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),(int)in_stack_fffffffffffffb18);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
             in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  dVar6 = dVar39 * dVar39;
  dVar7 = dVar38 * dVar38;
  dVar8 = dVar37 * dVar37;
  dVar9 = dVar6 + dVar7 + dVar8;
  dVar10 = pow(dVar9,1.5);
  dVar11 = pow(dVar9,2.5);
  dVar11 = 1.0 / dVar11;
  dVar12 = pow(dVar9,3.5);
  dVar12 = 1.0 / dVar12;
  dVar9 = pow(dVar9,5.5);
  dVar9 = 1.0 / dVar9;
  dVar13 = (dVar6 + dVar7) - dVar8 * 4.0;
  dVar14 = pow(1.0 / dVar10,3.0);
  dVar15 = dVar6 * 3.0 + dVar7 * 3.0;
  dVar16 = dVar15 - (dVar8 + dVar8);
  dVar15 = dVar15 - dVar8 * 4.0;
  dVar10 = in_XMM2_Qa * (1.0 / dVar10);
  dVar17 = in_XMM2_Qa * dVar11 * dVar39;
  dVar18 = dVar17 * dVar37 * 3.0;
  dVar19 = in_XMM2_Qa * dVar11 * dVar38 * dVar37 * 3.0;
  dVar20 = in_XMM3_Qa * in_XMM2_Qa * in_XMM0_Qa * in_XMM0_Qa;
  dVar21 = in_XMM4_Qa * in_XMM2_Qa;
  dVar22 = dVar21 * dVar14;
  dVar23 = dVar22 * dVar15;
  dVar24 = dVar20 * dVar12;
  dVar25 = dVar20 * dVar13 * dVar14;
  dVar26 = dVar25 * dVar39;
  dVar17 = (dVar26 * dVar38 * 10.5 +
           ((dVar17 * dVar38 * 3.0 + dVar22 * dVar39 * dVar38 * dVar37 * 15.0) -
           dVar24 * dVar39 * dVar38 * 3.0)) -
           dVar21 * dVar9 * dVar15 * dVar39 * dVar38 * dVar37 * 22.5;
  dVar27 = dVar23 * dVar37 * 2.5 + (-(dVar20 * dVar13 * dVar12) * 1.5 - dVar10);
  dVar28 = dVar21 * dVar9 *
           (((dVar6 * dVar7 * 6.0 + dVar8 * dVar8 * 8.0 + dVar6 * dVar6 * 3.0 + dVar7 * dVar7 * 3.0)
            - dVar6 * dVar8 * 24.0) - dVar7 * dVar8 * 24.0);
  dVar29 = dVar20 * dVar14 * dVar16;
  dVar30 = dVar24 * dVar39 * dVar37;
  dVar31 = pow(dVar39,3.0);
  dVar32 = dVar24 * dVar38 * dVar37;
  dVar33 = pow(dVar38,3.0);
  dVar34 = dVar21 * dVar8 * dVar14;
  dVar35 = dVar21 * dVar8 * dVar9 * dVar15;
  dVar36 = pow(dVar37,3.0);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x115ccd);
  *pSVar5 = (dVar20 * dVar6 * dVar13 * dVar14 * 10.5 +
            dVar21 * dVar6 * dVar14 * dVar37 * 15.0 +
            ((in_XMM2_Qa * dVar6 * 3.0 * dVar11 + dVar27) - dVar20 * dVar6 * dVar12 * 3.0)) -
            dVar21 * dVar6 * dVar9 * dVar15 * dVar37 * 22.5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x115d14);
  *pSVar5 = dVar17;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x115d5b);
  *pSVar5 = dVar29 * dVar39 * dVar37 * 10.5 +
            ((dVar28 * dVar39 * 4.5 +
             (dVar18 - dVar22 * (dVar31 * 12.0 + (dVar7 * dVar39 * 12.0 - dVar8 * dVar39 * 48.0)) *
                       0.5)) - dVar30 * 9.0);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x115da3);
  *pSVar5 = dVar17;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x115deb);
  *pSVar5 = (dVar20 * dVar7 * dVar13 * dVar14 * 10.5 +
            dVar21 * dVar7 * dVar14 * dVar37 * 15.0 +
            ((in_XMM2_Qa * dVar7 * 3.0 * dVar11 + dVar27) - dVar20 * dVar7 * dVar12 * 3.0)) -
            dVar21 * dVar7 * dVar9 * dVar15 * dVar37 * 22.5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x115e33);
  *pSVar5 = dVar29 * dVar38 * dVar37 * 10.5 +
            ((dVar28 * dVar38 * 4.5 +
             (dVar19 - dVar22 * (dVar33 * 12.0 + (dVar6 * dVar38 * 12.0 - dVar8 * dVar38 * 48.0)) *
                       0.5)) - dVar32 * 9.0);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x115e7b);
  *pSVar5 = dVar26 * dVar37 * 10.5 +
            dVar30 * 12.0 +
            ((dVar23 * dVar39 * 2.5 + (dVar18 - dVar34 * dVar39 * 20.0)) - dVar35 * dVar39 * 22.5);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x115ec3);
  *pSVar5 = dVar25 * dVar38 * dVar37 * 10.5 +
            dVar32 * 12.0 +
            ((dVar23 * dVar38 * 2.5 + (dVar19 - dVar34 * dVar38 * 20.0)) - dVar35 * dVar38 * 22.5);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x115f0b);
  *pSVar5 = dVar20 * dVar8 * dVar14 * dVar16 * 10.5 +
            dVar28 * dVar37 * 4.5 +
            ((dVar20 * dVar8 * dVar12 * 6.0 +
             (in_XMM2_Qa * dVar8 * dVar11 * 3.0 - dVar10) +
             dVar22 * (dVar6 * dVar37 * 48.0 + dVar7 * dVar37 * 48.0 + dVar36 * -32.0) * 0.5) -
            dVar24 * dVar16 * 1.5);
  dVar37 = dVar2 - dVar3 * dVar39;
  dVar6 = dVar3 * dVar38 + dVar1;
  dVar7 = pow(dVar37,2.0);
  dVar8 = pow(dVar6,2.0);
  dVar9 = pow(__x,2.0);
  dVar10 = dVar7 + dVar8 + dVar9;
  dVar11 = sqrt(dVar10);
  dVar11 = 1.0 / dVar11;
  dVar10 = sqrt(dVar10);
  dVar12 = in_XMM5_Qa * dVar37 * dVar6 * dVar11 * dVar3;
  dVar38 = dVar1 + dVar1 + dVar3 * dVar38 + dVar3 * dVar38;
  dVar39 = (dVar2 + dVar2) - (dVar3 * dVar39 + dVar3 * dVar39);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x116195);
  *pSVar5 = *pSVar5 + dVar12;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x116223);
  *pSVar5 = *pSVar5 + in_XMM5_Qa * dVar10 * dVar3 + in_XMM5_Qa * dVar7 * dVar11 * dVar3;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x1162ab);
  *pSVar5 = in_XMM5_Qa * dVar37 * dVar11 * __x * dVar3 + *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x116352);
  *pSVar5 = *pSVar5 + (-in_XMM5_Qa * dVar10 * dVar3 - in_XMM5_Qa * dVar8 * dVar11 * dVar3);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x1163ad);
  *pSVar5 = *pSVar5 + -dVar12;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x116441);
  *pSVar5 = -in_XMM5_Qa * dVar6 * dVar11 * __x * dVar3 + *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x1164e3);
  *pSVar5 = *pSVar5 + (in_XMM5_Qa * dVar6 * dVar11 * dVar38 * -0.5 - in_XMM5_Qa * dVar10);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x11655a);
  *pSVar5 = in_XMM5_Qa * dVar37 * dVar11 * dVar38 * -0.5 + *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x1165da);
  *pSVar5 = in_XMM5_Qa * dVar11 * dVar38 * __x * -0.5 + *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x116657);
  *pSVar5 = in_XMM5_Qa * dVar6 * dVar11 * dVar39 * -0.5 + *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x1166e4);
  *pSVar5 = *pSVar5 + (in_XMM5_Qa * dVar37 * dVar11 * dVar39 * -0.5 - in_XMM5_Qa * dVar10);
  dVar39 = in_XMM5_Qa * dVar11 * dVar39 * __x;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x11674f);
  *pSVar5 = dVar39 * -0.5 + *pSVar5;
  dVar38 = -in_XMM5_Qa * dVar6 * dVar11;
  dVar39 = __x;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x1167d3);
  *pSVar5 = dVar38 * dVar39 + *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffaf0,(Index)in_stack_fffffffffffffae8,0x116855);
  *pSVar5 = -in_XMM5_Qa * dVar37 * dVar11 * __x + *pSVar5;
  this = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
         (-in_XMM5_Qa * dVar10 - in_XMM5_Qa * dVar9 * dVar11);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffffae8,0x1168da);
  *pSVar5 = (double)this + *pSVar5;
  return in_RDI;
}

Assistant:

Eigen::MatrixXd GetGravJac(Eigen::Vector3d pos, Eigen::Vector3d vel, double Rearth, double wEarth, double mu, double J2, double J3, double drag_coeff){

		//extract locals
		double x = pos[0];
		double y = pos[1];
		double z = pos[2];
		double v_x = vel[0];
		double v_y = vel[1];
		double v_z = vel[2];

		//initialize matrix
		Eigen::MatrixXd jac = Eigen::MatrixXd::Zero(6,6);

		//velocity component
		jac.block(0,3,3,3) = Eigen::Matrix3d::Identity(3,3);

		//vector A which will be reshaped
		double A_vec[9];

		////// Begin auto-generated code from matlab /////////////

		double t3;
		double t5;
		double t7;
		double t9;
		double t11;
		double t14;
		double t47;
		double t23;
		double t25;
		double t26;
		double t27;
		double t29;
		double t24;
		double t28;
		double t30;
		double t31;
		double t32;
		double t35;
		double t36;
		double t40_tmp;
		double t42_tmp_tmp;
		double t42_tmp;
		double b_t42_tmp;
		double t47_tmp_tmp;
		double b_t47_tmp_tmp;
		double t47_tmp;
		double A_vec_tmp;
		double b_A_vec_tmp;
		double c_A_vec_tmp;

		/* CREATEA */
		/*     A_VEC = CREATEA(J2,J3,REARTH,MU,X,Y,Z) */
		/*     This function was generated by the Symbolic Math Toolbox version 8.4. */
		/*     03-Apr-2021 15:18:59 */
		t3 = x * x;
		t5 = y * y;
		t7 = z * z;
		t9 = t3 * 3.0;
		t11 = t5 * 3.0;
		t14 = t7 * 4.0;
		t47 = t3 + t5;
		t23 = t47 + t7;
		t25 = 1.0 / pow(t23, 1.5);
		t26 = 1.0 / pow(t23, 2.5);
		t27 = 1.0 / pow(t23, 3.5);
		t29 = 1.0 / pow(t23, 5.5);
		t24 = t47 + -t14;
		t28 = pow(t25, 3.0);
		t23 = t9 + t11;
		t30 = t23 + -(t7 * 2.0);
		t31 = t23 + -t14;
		t32 = mu * t25;
		t23 = mu * t26;
		t47 = t23 * x;
		t35 = t47 * z * 3.0;
		t36 = t23 * y * z * 3.0;
		t40_tmp = J2 * mu * (Rearth * Rearth);
		t23 = t40_tmp * t24;
		t42_tmp_tmp = J3 * mu;
		t42_tmp = t42_tmp_tmp * t28;
		b_t42_tmp = t42_tmp * t31;
		t14 = t42_tmp_tmp * t29;
		t47_tmp_tmp = t40_tmp * t27;
		t25 = t47_tmp_tmp * x;
		b_t47_tmp_tmp = t23 * t28;
		t47_tmp = b_t47_tmp_tmp * x;
		t47 = (((t47 * y * 3.0 + t42_tmp * x * y * z * 15.0) + -(t25 * y * 3.0)) +
		 t47_tmp * y * 10.5) + -(t14 * t31 * x * y * z * 22.5);
		A_vec_tmp = t40_tmp * t3;
		b_A_vec_tmp = t42_tmp_tmp * t3;
		c_A_vec_tmp = (-t32 + -(t23 * t27 * 1.5)) + b_t42_tmp * z * 2.5;
		A_vec[0] = ((((c_A_vec_tmp + mu * t9 * t26) - A_vec_tmp * t27 * 3.0) +
		       b_A_vec_tmp * t28 * z * 15.0) + A_vec_tmp * t24 * t28 * 10.5) -
		b_A_vec_tmp * t29 * t31 * z * 22.5;
		A_vec[1] = t47;
		A_vec_tmp = t14 * (((((t3 * t3 * 3.0 + t5 * t5 * 3.0) + t7 * t7 * 8.0) + t3 *
		               t5 * 6.0) + -(t3 * t7 * 24.0)) + -(t5 * t7 * 24.0));
		b_A_vec_tmp = t40_tmp * t28 * t30;
		t14 = t25 * z;
		A_vec[2] = (((t35 - t42_tmp * ((t5 * x * 12.0 - t7 * x * 48.0) + pow(x,
		3.0) * 12.0) / 2.0) + A_vec_tmp * x * 4.5) - t14 * 9.0) + b_A_vec_tmp * x *
		z * 10.5;
		A_vec[3] = t47;
		t23 = t40_tmp * t5;
		t47 = t42_tmp_tmp * t5;
		A_vec[4] = ((((c_A_vec_tmp + mu * t11 * t26) - t23 * t27 * 3.0) + t47 * t28 *
		       z * 15.0) + t23 * t24 * t28 * 10.5) - t47 * t29 * t31 * z * 22.5;
		c_A_vec_tmp = t47_tmp_tmp * y * z;
		A_vec[5] = (((t36 - t42_tmp * ((t3 * y * 12.0 - t7 * y * 48.0) + pow(y,
		3.0) * 12.0) / 2.0) + A_vec_tmp * y * 4.5) - c_A_vec_tmp * 9.0) +
		b_A_vec_tmp * y * z * 10.5;
		b_A_vec_tmp = t42_tmp_tmp * t7;
		t23 = b_A_vec_tmp * t28;
		b_A_vec_tmp = b_A_vec_tmp * t29 * t31;
		A_vec[6] = ((((t35 - t23 * x * 20.0) + b_t42_tmp * x * 2.5) - b_A_vec_tmp * x *
		       22.5) + t14 * 12.0) + t47_tmp * z * 10.5;
		A_vec[7] = ((((t36 - t23 * y * 20.0) + b_t42_tmp * y * 2.5) - b_A_vec_tmp * y *
		       22.5) + c_A_vec_tmp * 12.0) + b_t47_tmp_tmp * y * z * 10.5;
		b_A_vec_tmp = t40_tmp * t7;
		A_vec[8] = (((((-t32 + mu * t7 * t26 * 3.0) + t42_tmp * ((t3 * z * 48.0 + t5 *
		z * 48.0) - pow(z, 3.0) * 32.0) / 2.0) + b_A_vec_tmp * t27 * 6.0) -
		       t47_tmp_tmp * t30 * 1.5) + A_vec_tmp * z * 4.5) + b_A_vec_tmp *
		t28 * t30 * 10.5;


		///////////////// end matlab code /////////////////////

		//reshape A
		jac(3,0) = A_vec[0];
		jac(4,0) = A_vec[1];
		jac(5,0) = A_vec[2];
		jac(3,1) = A_vec[3];
		jac(4,1) = A_vec[4];
		jac(5,1) = A_vec[5];
		jac(3,2) = A_vec[6];
		jac(4,2) = A_vec[7];
		jac(5,2) = A_vec[8];



		/////////// begin matlab drag code /////////

		t5 = wEarth*x;
		double t2 = -t5+v_y;
		t3 = wEarth*y;
		double t4 = t3+v_x;
		double t6 = pow(t2,2.0);
		t7 = pow(t4,2.0);
		double t8 = pow(v_z,2.0);
		t9 = t6+t7+t8;
		double t10 = 1.0/sqrt(t9);
		t11 = sqrt(t9);
		double t12 = drag_coeff*t2*t4*t10*wEarth;
		double t13 = v_x*2.0;
		t14 = wEarth*y*2.0;
		double t15 = t13+t14;
		double t16 = v_y*2.0;
		double t18 = wEarth*x*2.0;
		double t17 = t16-t18;
		jac(3,0) += t12;
		jac(4,0) += drag_coeff*t11*wEarth+drag_coeff*t6*t10*wEarth;
		jac(5,0) += drag_coeff*t2*t10*v_z*wEarth;
		jac(3,1) += -drag_coeff*t11*wEarth-drag_coeff*t7*t10*wEarth;
		jac(4,1) += -t12;
		jac(5,1) += -drag_coeff*t4*t10*v_z*wEarth;
		jac(3,3) += -drag_coeff*t11-drag_coeff*t4*t10*t15*(1.0/2.0);
		jac(4,3) += drag_coeff*t2*t10*t15*(-1.0/2.0);
		jac(5,3) += drag_coeff*t10*t15*v_z*(-1.0/2.0);
		jac(3,4) += drag_coeff*t4*t10*t17*(-1.0/2.0);
		jac(4,4) += -drag_coeff*t11-drag_coeff*t2*t10*t17*(1.0/2.0);
		jac(5,4) += drag_coeff*t10*t17*v_z*(-1.0/2.0);
		jac(3,5) += -drag_coeff*t4*t10*v_z;
		jac(4,5) += -drag_coeff*t2*t10*v_z;
		jac(5,5) += -drag_coeff*t11-drag_coeff*t8*t10;


		////////////////////// end matlab drag code ////////////////


		//return
		return jac;

	}